

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.hpp
# Opt level: O1

void __thiscall Diligent::DeviceContextGLImpl::BindInfo::Invalidate(BindInfo *this)

{
  long lVar1;
  RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> local_148 [4];
  long local_108 [17];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined8 uStack_2c;
  
  lVar1 = 0;
  memset(local_148,0,0x124);
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[0] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[1] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[2] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[3] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[4] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[5] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[6] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[7] = (ShaderResourceCacheGL *)0x0;
  do {
    if (*(long *)((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pRefCounters +
                 lVar1) != *(long *)((long)local_108 + lVar1)) {
      RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
                 ((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pRefCounters +
                 lVar1));
      *(undefined8 *)
       ((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pObject + lVar1) =
           *(undefined8 *)((long)local_108 + lVar1 + 8);
      *(undefined8 *)
       ((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pRefCounters + lVar1) =
           *(undefined8 *)((long)local_108 + lVar1);
      *(undefined8 *)((long)local_108 + lVar1) = 0;
      *(undefined8 *)((long)local_108 + lVar1 + 8) = 0;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  (this->super_CommittedShaderResources).ResourcesValidated = (bool)(undefined1)local_68;
  (this->super_CommittedShaderResources).ActiveSRBMask = local_68._1_1_;
  (this->super_CommittedShaderResources).StaleSRBMask = local_68._2_1_;
  (this->super_CommittedShaderResources).DynamicSRBMask = local_68._3_1_;
  *(undefined8 *)((this->super_CommittedShaderResources).CacheRevisions._M_elems + 4) = local_78;
  *(undefined8 *)((this->super_CommittedShaderResources).CacheRevisions._M_elems + 6) = uStack_70;
  *(long *)(this->super_CommittedShaderResources).CacheRevisions._M_elems = local_108[0x10];
  *(undefined8 *)((this->super_CommittedShaderResources).CacheRevisions._M_elems + 2) = uStack_80;
  *(undefined8 *)&(this->super_CommittedShaderResources).field_0xe4 = local_64;
  *(undefined8 *)&this->field_0xec = uStack_5c;
  *(undefined8 *)&this->field_0xf4 = local_54;
  *(undefined8 *)&this->field_0xfc = uStack_4c;
  *(undefined8 *)&this->field_0x104 = local_44;
  *(undefined8 *)&this->field_0x10c = uStack_3c;
  *(undefined8 *)&this->field_0x114 = local_34;
  *(undefined8 *)&this->field_0x11c = uStack_2c;
  lVar1 = 0xb0;
  do {
    RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
              ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
               ((long)&local_148[0].m_pRefCounters + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0x30);
  return;
}

Assistant:

void Invalidate()
        {
            *this = {};
        }